

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O3

int __thiscall cmCTest::ProcessSteps(cmCTest *this)

{
  byte bVar1;
  pointer pcVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  cmCTestGenericHandler *pcVar6;
  unsigned_long uVar7;
  long *plVar8;
  uint uVar9;
  size_type *psVar10;
  ulong dindex;
  bool bVar11;
  double dVar12;
  string fullname;
  Directory d;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  string notes_dir;
  string local_200;
  int local_1dc;
  Directory local_1d8;
  string local_1d0;
  string *local_1b0;
  string local_1a8 [3];
  ios_base local_138 [264];
  
  lVar5 = 0x148;
  do {
    bVar1 = *(byte *)((long)&this->RepeatTests + lVar5);
    if (bVar1 != 0) break;
    bVar11 = lVar5 != 0x3c8;
    lVar5 = lVar5 + 0x40;
  } while (bVar11);
  local_1dc = 0;
  bVar11 = false;
  uVar9 = 0;
  if (this->Parts[1].Enabled != false) {
    dVar12 = GetRemainingTimeAllowed(this);
    bVar11 = false;
    uVar9 = 0;
    if (0.0 < dVar12 + -120.0) {
      pcVar6 = GetHandler(this,"update");
      local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"SourceDirectory","");
      local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"SourceDirectory","");
      GetCTestConfiguration(&local_200,this,&local_1d0);
      cmCTestGenericHandler::SetPersistentOption(pcVar6,local_1a8,local_200._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_200._M_dataplus._M_p != &local_200.field_2) {
        operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
        operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
        operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1
                       );
      }
      uVar3 = (*pcVar6->_vptr_cmCTestGenericHandler[1])(pcVar6);
      uVar9 = uVar3 >> 0x1f;
      bVar11 = uVar3 != 0;
    }
  }
  if ((!bVar11) && (this->TestModel == 2)) {
    return local_1dc;
  }
  if ((this->Parts[2].Enabled == true) &&
     (dVar12 = GetRemainingTimeAllowed(this), 0.0 < dVar12 + -120.0)) {
    pcVar6 = GetHandler(this,"configure");
    iVar4 = (*pcVar6->_vptr_cmCTestGenericHandler[1])(pcVar6);
    uVar9 = uVar9 + (iVar4 >> 0x1f) * -2;
  }
  if ((this->Parts[3].Enabled == true) &&
     (dVar12 = GetRemainingTimeAllowed(this), 0.0 < dVar12 + -120.0)) {
    UpdateCTestConfiguration(this);
    pcVar6 = GetHandler(this,"build");
    iVar4 = (*pcVar6->_vptr_cmCTestGenericHandler[1])(pcVar6);
    uVar9 = uVar9 + (iVar4 >> 0x1f) * -4;
  }
  if (((byte)(bVar1 ^ 1 | this->Parts[4].Enabled) == 1) &&
     (dVar12 = GetRemainingTimeAllowed(this), 0.0 < dVar12 + -120.0)) {
    UpdateCTestConfiguration(this);
    pcVar6 = GetHandler(this,"test");
    iVar4 = (*pcVar6->_vptr_cmCTestGenericHandler[1])(pcVar6);
    uVar9 = uVar9 + (iVar4 >> 0x1f) * -8;
  }
  if ((this->Parts[5].Enabled == true) &&
     (dVar12 = GetRemainingTimeAllowed(this), 0.0 < dVar12 + -120.0)) {
    UpdateCTestConfiguration(this);
    pcVar6 = GetHandler(this,"coverage");
    uVar3 = (*pcVar6->_vptr_cmCTestGenericHandler[1])(pcVar6);
    uVar9 = (uVar3 >> 0x1a & 0xffffffe0) + uVar9;
  }
  if ((this->Parts[6].Enabled == true) &&
     (dVar12 = GetRemainingTimeAllowed(this), 0.0 < dVar12 + -120.0)) {
    UpdateCTestConfiguration(this);
    pcVar6 = GetHandler(this,"memcheck");
    uVar3 = (*pcVar6->_vptr_cmCTestGenericHandler[1])(pcVar6);
    uVar9 = uVar3 >> 0x1b & 0xfffffff0 | uVar9;
  }
  if (bVar1 != 0) {
    local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
    pcVar2 = (this->BinaryDir)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1a8,pcVar2,pcVar2 + (this->BinaryDir)._M_string_length);
    std::__cxx11::string::append((char *)local_1a8);
    bVar11 = cmsys::SystemTools::FileIsDirectory(local_1a8);
    if (bVar11) {
      cmsys::Directory::Directory(&local_1d8);
      cmsys::Directory::Load(&local_1d8,local_1a8);
      local_1b0 = &this->NotesFiles;
      for (dindex = 0; uVar7 = cmsys::Directory::GetNumberOfFiles(&local_1d8), dindex < uVar7;
          dindex = dindex + 1) {
        cmsys::Directory::GetFile(&local_1d8,dindex);
        local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1d0,local_1a8[0]._M_dataplus._M_p,
                   local_1a8[0]._M_dataplus._M_p + local_1a8[0]._M_string_length);
        std::__cxx11::string::append((char *)&local_1d0);
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_1d0);
        psVar10 = (size_type *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar10) {
          local_200.field_2._M_allocated_capacity = *psVar10;
          local_200.field_2._8_8_ = plVar8[3];
          local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
        }
        else {
          local_200.field_2._M_allocated_capacity = *psVar10;
          local_200._M_dataplus._M_p = (pointer)*plVar8;
        }
        local_200._M_string_length = plVar8[1];
        *plVar8 = (long)psVar10;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
          operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
        }
        bVar11 = cmsys::SystemTools::FileExists(local_200._M_dataplus._M_p);
        if ((bVar11) && (bVar11 = cmsys::SystemTools::FileIsDirectory(&local_200), !bVar11)) {
          if ((this->NotesFiles)._M_string_length != 0) {
            std::__cxx11::string::append((char *)local_1b0);
          }
          std::__cxx11::string::_M_append((char *)local_1b0,(ulong)local_200._M_dataplus._M_p);
          this->Parts[8].Enabled = true;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_200._M_dataplus._M_p != &local_200.field_2) {
          operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
        }
      }
      cmsys::Directory::~Directory(&local_1d8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
      operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
    }
  }
  if ((this->Parts[8].Enabled == true) &&
     (UpdateCTestConfiguration(this), (this->NotesFiles)._M_string_length != 0)) {
    GenerateNotesFile(this,(this->NotesFiles)._M_dataplus._M_p);
  }
  if (this->Parts[7].Enabled == true) {
    UpdateCTestConfiguration(this);
    pcVar6 = GetHandler(this,"submit");
    iVar4 = (*pcVar6->_vptr_cmCTestGenericHandler[1])(pcVar6);
    if (iVar4 < 0) {
      uVar9 = uVar9 | 0x40;
      goto LAB_0028a251;
    }
  }
  if (uVar9 == 0) {
    return local_1dc;
  }
LAB_0028a251:
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"Errors while running CTest",0x1a);
  std::ios::widen((char)local_1a8 + (char)*(undefined8 *)(local_1a8[0]._M_dataplus._M_p + -0x18));
  std::ostream::put((char)local_1a8);
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  Log(this,6,
      "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx",
      0x39d,local_200._M_dataplus._M_p,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  return uVar9;
}

Assistant:

int cmCTest::ProcessSteps()
{
  int res = 0;
  bool notest = true;
  int update_count = 0;

  for (Part p = PartStart; notest && p != PartCount; p = Part(p + 1)) {
    notest = !this->Parts[p];
  }
  if (this->Parts[PartUpdate] && (this->GetRemainingTimeAllowed() - 120 > 0)) {
    cmCTestGenericHandler* uphandler = this->GetHandler("update");
    uphandler->SetPersistentOption(
      "SourceDirectory",
      this->GetCTestConfiguration("SourceDirectory").c_str());
    update_count = uphandler->ProcessHandler();
    if (update_count < 0) {
      res |= cmCTest::UPDATE_ERRORS;
    }
  }
  if (this->TestModel == cmCTest::CONTINUOUS && !update_count) {
    return 0;
  }
  if (this->Parts[PartConfigure] &&
      (this->GetRemainingTimeAllowed() - 120 > 0)) {
    if (this->GetHandler("configure")->ProcessHandler() < 0) {
      res |= cmCTest::CONFIGURE_ERRORS;
    }
  }
  if (this->Parts[PartBuild] && (this->GetRemainingTimeAllowed() - 120 > 0)) {
    this->UpdateCTestConfiguration();
    if (this->GetHandler("build")->ProcessHandler() < 0) {
      res |= cmCTest::BUILD_ERRORS;
    }
  }
  if ((this->Parts[PartTest] || notest) &&
      (this->GetRemainingTimeAllowed() - 120 > 0)) {
    this->UpdateCTestConfiguration();
    if (this->GetHandler("test")->ProcessHandler() < 0) {
      res |= cmCTest::TEST_ERRORS;
    }
  }
  if (this->Parts[PartCoverage] &&
      (this->GetRemainingTimeAllowed() - 120 > 0)) {
    this->UpdateCTestConfiguration();
    if (this->GetHandler("coverage")->ProcessHandler() < 0) {
      res |= cmCTest::COVERAGE_ERRORS;
    }
  }
  if (this->Parts[PartMemCheck] &&
      (this->GetRemainingTimeAllowed() - 120 > 0)) {
    this->UpdateCTestConfiguration();
    if (this->GetHandler("memcheck")->ProcessHandler() < 0) {
      res |= cmCTest::MEMORY_ERRORS;
    }
  }
  if (!notest) {
    std::string notes_dir = this->BinaryDir + "/Testing/Notes";
    if (cmSystemTools::FileIsDirectory(notes_dir)) {
      cmsys::Directory d;
      d.Load(notes_dir);
      unsigned long kk;
      for (kk = 0; kk < d.GetNumberOfFiles(); kk++) {
        const char* file = d.GetFile(kk);
        std::string fullname = notes_dir + "/" + file;
        if (cmSystemTools::FileExists(fullname.c_str()) &&
            !cmSystemTools::FileIsDirectory(fullname)) {
          if (!this->NotesFiles.empty()) {
            this->NotesFiles += ";";
          }
          this->NotesFiles += fullname;
          this->Parts[PartNotes].Enable();
        }
      }
    }
  }
  if (this->Parts[PartNotes]) {
    this->UpdateCTestConfiguration();
    if (!this->NotesFiles.empty()) {
      this->GenerateNotesFile(this->NotesFiles.c_str());
    }
  }
  if (this->Parts[PartSubmit]) {
    this->UpdateCTestConfiguration();
    if (this->GetHandler("submit")->ProcessHandler() < 0) {
      res |= cmCTest::SUBMIT_ERRORS;
    }
  }
  if (res != 0) {
    cmCTestLog(this, ERROR_MESSAGE, "Errors while running CTest" << std::endl);
  }
  return res;
}